

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O1

void __thiscall
adios2::transport::FilePOSIX::Open
          (FilePOSIX *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  pointer pcVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  _State_baseV2 *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Result<int> *p_Var6;
  int *piVar7;
  long *plVar8;
  size_type *psVar9;
  element_type *peVar10;
  element_type *peVar11;
  string *process;
  bool bVar12;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  undefined1 local_178 [32];
  __basic_future<int> local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  long *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  this->m_DirectIO = directio;
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"open","");
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    iVar4 = open((this->super_Transport).m_Name._M_dataplus._M_p,(uint)directio << 0xe | 0x42,0x1ff)
    ;
    this->m_FileDescriptor = iVar4;
    lseek(iVar4,0,2);
    this->m_Errno = *piVar7;
    peVar11 = (element_type *)&local_b0.field_2;
    process = &local_b0;
    local_b0._M_dataplus._M_p = (pointer)peVar11;
LAB_006552a4:
    std::__cxx11::string::_M_construct<char_const*>((string *)process,"open","");
    Transport::ProfilerStop(&this->super_Transport,process);
    peVar10 = (element_type *)(process->_M_dataplus)._M_p;
    if (peVar10 == peVar11) goto LAB_006552c4;
  }
  else {
    if (openMode == Read) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      piVar7 = __errno_location();
      *piVar7 = 0;
      iVar4 = open((this->super_Transport).m_Name._M_dataplus._M_p,0);
      this->m_FileDescriptor = iVar4;
      this->m_Errno = *piVar7;
      peVar11 = (element_type *)&local_f0.field_2;
      process = &local_f0;
      local_f0._M_dataplus._M_p = (pointer)peVar11;
      goto LAB_006552a4;
    }
    if (openMode == Write) {
      if (async) {
        this->m_IsOpening = true;
        local_178._0_8_ = (element_type *)0x0;
        local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00885ea8;
        peVar11 = (element_type *)(p_Var5 + 1);
        p_Var5[2]._M_use_count = 0;
        p_Var5[1]._M_use_count = 0;
        p_Var5[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
        p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var5[3]._M_use_count = 0;
        p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00885ef8;
        p_Var6 = (_Result<int> *)operator_new(0x18);
        std::__future_base::_Result<int>::_Result(p_Var6);
        p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
        *(bool *)&p_Var5[4]._M_use_count = directio;
        local_140 = p_Var5 + 6;
        p_Var5[5]._vptr__Sp_counted_base = (_func_int **)local_140;
        pcVar1 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(p_Var5 + 5),pcVar1,pcVar1 + name->_M_string_length);
        p_Var5[7]._vptr__Sp_counted_base = (_func_int **)this;
        local_158._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_138 = (long *)operator_new(0x20);
        *local_138 = (long)&PTR___State_00885f50;
        local_138[1] = (long)peVar11;
        local_138[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FilePOSIX.cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>
                             ::_M_run;
        local_138[3] = 0;
        std::thread::_M_start_thread(&local_158,&local_138,0);
        if (local_138 != (long *)0x0) {
          (**(code **)(*local_138 + 8))();
        }
        uVar2 = local_178._8_8_;
        if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        p_Var5[3]._vptr__Sp_counted_base =
             (_func_int **)
             local_158._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        bVar12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_178._0_8_ = peVar11;
        local_178._8_8_ = p_Var5;
        if (bVar12) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_178._0_8_ == (element_type *)0x0) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
          p_Var5->_M_use_count = 1;
          p_Var5->_M_weak_count = 1;
          p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00885f90;
          p_Var5[2]._M_use_count = 0;
          p_Var5[1]._M_use_count = 0;
          p_Var5[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
          p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00885fe0;
          p_Var6 = (_Result<int> *)operator_new(0x18);
          local_140 = p_Var5 + 3;
          std::__future_base::_Result<int>::_Result(p_Var6);
          p_Var5[3]._vptr__Sp_counted_base = (_func_int **)p_Var6;
          *(bool *)&p_Var5[3]._M_use_count = directio;
          p_Var5[4]._vptr__Sp_counted_base = (_func_int **)(p_Var5 + 5);
          pcVar1 = (name->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(p_Var5 + 4),pcVar1,pcVar1 + name->_M_string_length);
          uVar2 = local_178._8_8_;
          p_Var5[6]._vptr__Sp_counted_base = (_func_int **)this;
          bVar12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_178._0_8_ = (element_type *)(p_Var5 + 1);
          local_178._8_8_ = p_Var5;
          if (bVar12) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
          }
        }
        std::__basic_future<int>::__basic_future(&local_158,(__state_type *)local_178);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
        }
        _Var3._M_pi = local_158._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        peVar11 = local_158._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        local_158._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_158._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var5 = (this->m_OpenFuture).super___basic_future<int>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->m_OpenFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar11;
        (this->m_OpenFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var3._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if (local_158._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        goto LAB_006552c4;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      piVar7 = __errno_location();
      *piVar7 = 0;
      iVar4 = open((this->super_Transport).m_Name._M_dataplus._M_p,(uint)directio << 0xe | 0x241,
                   0x1b6);
      this->m_FileDescriptor = iVar4;
      this->m_Errno = *piVar7;
      peVar11 = (element_type *)&local_70.field_2;
      process = &local_70;
      local_70._M_dataplus._M_p = (pointer)peVar11;
      goto LAB_006552a4;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   "unknown open mode for file ",__rhs);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_178);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    CheckFile(this,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    peVar10 = (element_type *)local_178._0_8_;
    if ((element_type *)local_178._0_8_ == (element_type *)(local_178 + 0x10)) goto LAB_006552c4;
  }
  operator_delete(peVar10);
LAB_006552c4:
  if (this->m_IsOpening == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   "couldn\'t open file ",__rhs);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_178);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130.field_2._8_8_ = plVar8[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_130._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    CheckFile(this,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FilePOSIX::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name, const bool directio) -> int {
        ProfilerStart("open");
        errno = 0;
        int flag = __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio);
        int FD = open(m_Name.c_str(), flag, 0666);
        m_Errno = errno;
        ProfilerStop("open");
        return FD;
    };

    m_Name = name;
    CheckName();
    m_DirectIO = directio;
    m_OpenMode = openMode;
    switch (m_OpenMode)
    {

    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name, directio);
        }
        else
        {
            ProfilerStart("open");
            errno = 0;
            m_FileDescriptor =
                open(m_Name.c_str(),
                     __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio), 0666);
            m_Errno = errno;
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor =
            open(m_Name.c_str(), __GetOpenFlag(O_RDWR | O_CREAT | O_BINARY, directio), 0777);
        lseek(m_FileDescriptor, 0, SEEK_END);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor = open(m_Name.c_str(), O_RDONLY | O_BINARY);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to POSIX open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name + ", in call to POSIX open");
        m_IsOpen = true;
    }
}